

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgtool.cpp
# Opt level: O0

int denoise(int argc,char **argv)

{
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  v;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  v_00;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  v_01;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  v_02;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  v_03;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  v_04;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  v_05;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  v_06;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  v_07;
  span<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  requestedChannels;
  span<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  requestedChannels_00;
  span<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  requestedChannels_01;
  span<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  requestedChannels_02;
  span<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  requestedChannels_03;
  span<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  requestedChannels_04;
  span<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  requestedChannels_05;
  span<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  requestedChannels_06;
  span<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  channels;
  FILE *__stream;
  int iVar1;
  bool bVar2;
  byte bVar3;
  ulong uVar4;
  undefined8 uVar5;
  long *in_RSI;
  undefined1 auVar6 [64];
  int c;
  ImageChannelValues Ldenoised;
  int x;
  int y;
  Image result;
  Image denoisedImage;
  int nLevels;
  int halfWidth;
  Image filteredVariance;
  Float xySigmaIndir [2];
  ImageChannelValues jointSigmaIndir;
  ImageChannelDesc jointDesc;
  ImageChannelDesc varianceDesc;
  ImageChannelDesc albedoDesc;
  ImageChannelDesc nsDesc;
  ImageChannelDesc nDesc;
  ImageChannelDesc deltaZDesc;
  ImageChannelDesc zDesc;
  ImageChannelDesc rgbDesc;
  anon_class_8_1_5d0e180a checkForChannels;
  Image *in;
  ImageAndMetadata im;
  anon_class_1_0_00000001 onError;
  string outFilename;
  string inFilename;
  nullptr_t in_stack_ffffffffffffed08;
  undefined1 *puVar7;
  size_type index;
  span<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *in_stack_ffffffffffffed10;
  ImageAndMetadata *this;
  undefined4 in_stack_ffffffffffffed18;
  undefined4 uVar8;
  WrapMode in_stack_ffffffffffffed1c;
  undefined4 in_stack_ffffffffffffed20;
  undefined4 uVar9;
  Float in_stack_ffffffffffffed24;
  size_t in_stack_ffffffffffffed28;
  ImageChannelValues *in_stack_ffffffffffffed30;
  undefined7 in_stack_ffffffffffffed40;
  undefined1 in_stack_ffffffffffffed47;
  undefined1 in_stack_ffffffffffffed48 [64];
  Image *in_stack_ffffffffffffed88;
  Tuple2<pbrt::Point2,_int> in_stack_ffffffffffffed90;
  Image *in_stack_ffffffffffffede8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffedf0;
  Image *in_stack_ffffffffffffedf8;
  array<pbrt::WrapMode,_2> in_stack_ffffffffffffee00;
  Tuple2<pbrt::Point2,_int> in_stack_ffffffffffffee08;
  ColorEncodingHandle *in_stack_ffffffffffffee20;
  PixelFormat in_stack_ffffffffffffee2c;
  Image *in_stack_ffffffffffffee30;
  Allocator in_stack_ffffffffffffee38;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffee40;
  size_t in_stack_ffffffffffffee48;
  Tuple2<pbrt::Point2,_int> in_stack_ffffffffffffee50;
  ImageChannelDesc *in_stack_ffffffffffffee60;
  Float *in_stack_ffffffffffffee68;
  int in_stack_ffffffffffffee74;
  ImageChannelDesc *in_stack_ffffffffffffee78;
  Image *in_stack_ffffffffffffee80;
  ImageChannelValues *in_stack_ffffffffffffeea0;
  function<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>
  *in_stack_ffffffffffffeee0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffeee8;
  string *in_stack_ffffffffffffeef0;
  char ***in_stack_ffffffffffffeef8;
  string *local_10a0;
  string *local_1050;
  string *local_ff0;
  string *local_fc0;
  string *local_f70;
  string *local_f20;
  string *local_ed0;
  string *local_e90;
  string *local_e60;
  optional<float> local_e00;
  aligned_storage_t<sizeof(pbrt::SquareMatrix<4>),_alignof(pbrt::SquareMatrix<4>)> local_df8;
  undefined4 local_db8;
  aligned_storage_t<sizeof(pbrt::SquareMatrix<4>),_alignof(pbrt::SquareMatrix<4>)> local_db4;
  undefined4 local_d74;
  aligned_storage_t<sizeof(pbrt::Bounds2<int>),_alignof(pbrt::Bounds2<int>)> local_d70;
  undefined4 local_d60;
  aligned_storage_t<sizeof(pbrt::Point2<int>),_alignof(pbrt::Point2<int>)> local_d5c;
  undefined4 local_d54;
  optional<int> local_d50;
  optional<float> local_d48;
  aligned_storage_t<sizeof(const_pbrt::RGBColorSpace_*),_alignof(const_pbrt::RGBColorSpace_*)>
  local_d40;
  undefined8 uStack_d38;
  undefined8 local_d30;
  undefined8 uStack_d28;
  undefined8 uStack_d20;
  undefined8 uStack_d18;
  undefined8 uStack_d10;
  undefined8 uStack_d08;
  int local_cf4;
  Tuple2<pbrt::Point2,_int> local_cb0;
  int local_ca8;
  Tuple2<pbrt::Point2,_int> local_ca4;
  int local_c9c;
  size_type local_c98;
  undefined1 local_c84;
  allocator<char> local_c83;
  allocator<char> local_c82;
  allocator<char> local_c81;
  string *local_c80;
  string local_c78 [32];
  undefined1 local_c58 [32];
  undefined1 local_c38 [32];
  string *local_c18;
  undefined8 local_c10;
  Tuple2<pbrt::Point2,_int> local_bf8;
  ImageChannelDesc *in_stack_fffffffffffff448;
  ImageChannelDesc *in_stack_fffffffffffff450;
  Image *in_stack_fffffffffffff458;
  ImageChannelDesc *in_stack_fffffffffffff460;
  Image *in_stack_fffffffffffff468;
  ImageChannelDesc *in_stack_fffffffffffff480;
  ImageChannelDesc *in_stack_fffffffffffff488;
  int in_stack_fffffffffffff490;
  int in_stack_fffffffffffff498;
  ImageMetadata *in_stack_fffffffffffff570;
  string *in_stack_fffffffffffff578;
  Image *in_stack_fffffffffffff580;
  allocator<char> local_864;
  allocator<char> local_863;
  allocator<char> local_862;
  allocator<char> local_861;
  undefined1 *local_860;
  ColorEncodingHandle *in_stack_fffffffffffff7a8;
  string *in_stack_fffffffffffff7b0;
  Allocator in_stack_fffffffffffff7b8;
  undefined1 local_838 [32];
  undefined1 local_818 [32];
  undefined1 local_7f8 [32];
  undefined1 *local_7d8;
  undefined8 local_7d0;
  undefined1 local_782;
  allocator<char> local_781;
  string *local_780;
  string local_778 [32];
  string *local_758;
  undefined8 local_750;
  undefined1 local_704;
  allocator<char> local_703;
  allocator<char> local_702;
  allocator<char> local_701;
  string *local_700;
  string local_6f8 [32];
  undefined1 local_6d8 [32];
  undefined1 local_6b8 [32];
  string *local_698;
  undefined8 local_690;
  undefined1 local_644;
  allocator<char> local_643;
  allocator<char> local_642;
  allocator<char> local_641;
  string *local_640;
  string local_638 [32];
  undefined1 local_618 [32];
  undefined1 local_5f8 [32];
  string *local_5d8;
  undefined8 local_5d0;
  undefined1 local_5b8 [54];
  allocator<char> local_582;
  allocator<char> local_581 [9];
  string local_578 [32];
  undefined1 local_558 [32];
  undefined1 local_538 [32];
  string *local_518;
  size_t local_510;
  undefined1 local_4c3;
  allocator<char> local_4c2;
  allocator<char> local_4c1;
  polymorphic_allocator<float> local_4c0;
  memory_resource local_4b8 [4];
  memory_resource local_498 [4];
  string local_478 [32];
  undefined1 local_458 [55];
  allocator<char> local_421 [9];
  string local_418 [32];
  string *local_3f8;
  optional<int> local_3f0;
  undefined1 local_3a4;
  allocator<char> local_3a3;
  allocator<char> local_3a2;
  allocator<char> local_3a1;
  string *local_3a0;
  string local_398 [32];
  undefined1 local_378 [32];
  undefined1 local_358 [32];
  string *local_338;
  undefined8 local_330;
  string *local_2e8;
  Image *local_2e0;
  Image local_2c8 [2];
  allocator<char> local_79;
  string local_78 [40];
  string local_50 [32];
  string local_30 [32];
  long *local_10;
  uint local_4;
  
  local_10 = in_RSI;
  std::__cxx11::string::string(local_30);
  std::__cxx11::string::string(local_50);
  while (*local_10 != 0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_ffffffffffffed48._8_8_,in_stack_ffffffffffffed48._0_8_,
               (allocator<char> *)CONCAT17(in_stack_ffffffffffffed47,in_stack_ffffffffffffed40));
    std::function<void(std::__cxx11::string)>::function<denoise(int,char**)::__0&,void>
              ((function<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>
                *)CONCAT44(in_stack_ffffffffffffed24,in_stack_ffffffffffffed20),
               (anon_class_1_0_00000001 *)
               CONCAT44(in_stack_ffffffffffffed1c,in_stack_ffffffffffffed18));
    bVar2 = pbrt::ParseArg<std::__cxx11::string*>
                      (in_stack_ffffffffffffeef8,in_stack_ffffffffffffeef0,in_stack_ffffffffffffeee8
                       ,in_stack_ffffffffffffeee0);
    std::
    function<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>
    ::~function((function<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>
                 *)0x3e5c5d);
    std::__cxx11::string::~string(local_78);
    std::allocator<char>::~allocator(&local_79);
    if (!bVar2) {
      if (*(char *)*local_10 == '-') {
        usage("denoise","%s: unknown command flag",*local_10);
      }
      else {
        uVar4 = std::__cxx11::string::empty();
        if ((uVar4 & 1) == 0) {
          usage("denoise","multiple input filenames provided.");
        }
        else {
          std::__cxx11::string::operator=(local_30,(char *)*local_10);
          local_10 = local_10 + 1;
        }
      }
    }
  }
  uVar4 = std::__cxx11::string::empty();
  if ((uVar4 & 1) != 0) {
    usage("denoise","input image filename must be provided.");
  }
  uVar4 = std::__cxx11::string::empty();
  if ((uVar4 & 1) != 0) {
    usage("denoise","output image filename must be provided.");
  }
  pstd::pmr::polymorphic_allocator<std::byte>::polymorphic_allocator
            ((polymorphic_allocator<std::byte> *)in_stack_ffffffffffffed10);
  pbrt::ColorEncodingHandle::TaggedPointer
            ((ColorEncodingHandle *)in_stack_ffffffffffffed10,in_stack_ffffffffffffed08);
  pbrt::Image::Read(in_stack_fffffffffffff7b0,in_stack_fffffffffffff7b8,in_stack_fffffffffffff7a8);
  local_2e0 = local_2c8;
  local_2e8 = local_30;
  local_3a4 = 1;
  local_3a0 = local_398;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffed48._8_8_,in_stack_ffffffffffffed48._0_8_,
             (allocator<char> *)CONCAT17(in_stack_ffffffffffffed47,in_stack_ffffffffffffed40));
  local_3a0 = (string *)local_378;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffed48._8_8_,in_stack_ffffffffffffed48._0_8_,
             (allocator<char> *)CONCAT17(in_stack_ffffffffffffed47,in_stack_ffffffffffffed40));
  local_3a0 = (string *)local_358;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffed48._8_8_,in_stack_ffffffffffffed48._0_8_,
             (allocator<char> *)CONCAT17(in_stack_ffffffffffffed47,in_stack_ffffffffffffed40));
  local_3a4 = 0;
  local_338 = local_398;
  local_330 = 3;
  v._M_array._4_4_ = in_stack_ffffffffffffed1c;
  v._M_array._0_4_ = in_stack_ffffffffffffed18;
  v._M_len._0_4_ = in_stack_ffffffffffffed20;
  v._M_len._4_4_ = in_stack_ffffffffffffed24;
  pstd::span<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::span(in_stack_ffffffffffffed10,v);
  requestedChannels.n = (size_t)in_stack_ffffffffffffedf8;
  requestedChannels.ptr = in_stack_ffffffffffffedf0;
  pbrt::Image::GetChannelDesc(in_stack_ffffffffffffede8,requestedChannels);
  local_e60 = (string *)&local_338;
  do {
    local_e60 = local_e60 + -0x20;
    std::__cxx11::string::~string(local_e60);
  } while (local_e60 != local_398);
  std::allocator<char>::~allocator(&local_3a3);
  std::allocator<char>::~allocator(&local_3a2);
  std::allocator<char>::~allocator(&local_3a1);
  denoise::anon_class_8_1_5d0e180a::operator()
            ((anon_class_8_1_5d0e180a *)
             CONCAT44(in_stack_ffffffffffffed24,in_stack_ffffffffffffed20),
             (ImageChannelDesc *)CONCAT44(in_stack_ffffffffffffed1c,in_stack_ffffffffffffed18),
             (char *)in_stack_ffffffffffffed10);
  local_458[0x36] = '\x01';
  local_421._1_8_ = local_418;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffed48._8_8_,in_stack_ffffffffffffed48._0_8_,
             (allocator<char> *)CONCAT17(in_stack_ffffffffffffed47,in_stack_ffffffffffffed40));
  local_458[0x36] = '\0';
  local_3f8 = local_418;
  local_3f0.optionalValue = (aligned_storage_t<sizeof(int),_alignof(int)>)0x1;
  local_3f0.set = false;
  local_3f0._5_3_ = 0;
  v_00._M_array._4_4_ = in_stack_ffffffffffffed1c;
  v_00._M_array._0_4_ = in_stack_ffffffffffffed18;
  v_00._M_len._0_4_ = in_stack_ffffffffffffed20;
  v_00._M_len._4_4_ = in_stack_ffffffffffffed24;
  pstd::span<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::span(in_stack_ffffffffffffed10,v_00);
  requestedChannels_00.n = (size_t)in_stack_ffffffffffffedf8;
  requestedChannels_00.ptr = in_stack_ffffffffffffedf0;
  pbrt::Image::GetChannelDesc(in_stack_ffffffffffffede8,requestedChannels_00);
  local_e90 = (string *)&local_3f8;
  do {
    local_e90 = local_e90 + -0x20;
    std::__cxx11::string::~string(local_e90);
  } while (local_e90 != local_418);
  std::allocator<char>::~allocator(local_421);
  denoise::anon_class_8_1_5d0e180a::operator()
            ((anon_class_8_1_5d0e180a *)
             CONCAT44(in_stack_ffffffffffffed24,in_stack_ffffffffffffed20),
             (ImageChannelDesc *)CONCAT44(in_stack_ffffffffffffed1c,in_stack_ffffffffffffed18),
             (char *)in_stack_ffffffffffffed10);
  local_4c3 = 1;
  local_4c0.memoryResource = local_4b8;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffed48._8_8_,in_stack_ffffffffffffed48._0_8_,
             (allocator<char> *)CONCAT17(in_stack_ffffffffffffed47,in_stack_ffffffffffffed40));
  local_4c0.memoryResource = local_498;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffed48._8_8_,in_stack_ffffffffffffed48._0_8_,
             (allocator<char> *)CONCAT17(in_stack_ffffffffffffed47,in_stack_ffffffffffffed40));
  local_4c3 = 0;
  local_478._0_8_ = local_4b8;
  local_478[8] = (string)0x2;
  local_478[9] = (string)0x0;
  local_478[10] = (string)0x0;
  local_478[0xb] = (string)0x0;
  local_478[0xc] = (string)0x0;
  local_478[0xd] = (string)0x0;
  local_478[0xe] = (string)0x0;
  local_478[0xf] = (string)0x0;
  v_01._M_array._4_4_ = in_stack_ffffffffffffed1c;
  v_01._M_array._0_4_ = in_stack_ffffffffffffed18;
  v_01._M_len._0_4_ = in_stack_ffffffffffffed20;
  v_01._M_len._4_4_ = in_stack_ffffffffffffed24;
  pstd::span<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::span(in_stack_ffffffffffffed10,v_01);
  requestedChannels_01.n = (size_t)in_stack_ffffffffffffedf8;
  requestedChannels_01.ptr = in_stack_ffffffffffffedf0;
  pbrt::Image::GetChannelDesc(in_stack_ffffffffffffede8,requestedChannels_01);
  local_ed0 = local_478;
  do {
    local_ed0 = local_ed0 + -0x20;
    std::__cxx11::string::~string(local_ed0);
  } while (local_ed0 != (string *)local_4b8);
  std::allocator<char>::~allocator(&local_4c2);
  std::allocator<char>::~allocator(&local_4c1);
  denoise::anon_class_8_1_5d0e180a::operator()
            ((anon_class_8_1_5d0e180a *)
             CONCAT44(in_stack_ffffffffffffed24,in_stack_ffffffffffffed20),
             (ImageChannelDesc *)CONCAT44(in_stack_ffffffffffffed1c,in_stack_ffffffffffffed18),
             (char *)in_stack_ffffffffffffed10);
  local_5b8[0x34] = 1;
  local_581._1_8_ = local_578;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffed48._8_8_,in_stack_ffffffffffffed48._0_8_,
             (allocator<char> *)CONCAT17(in_stack_ffffffffffffed47,in_stack_ffffffffffffed40));
  local_581._1_8_ = local_558;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffed48._8_8_,in_stack_ffffffffffffed48._0_8_,
             (allocator<char> *)CONCAT17(in_stack_ffffffffffffed47,in_stack_ffffffffffffed40));
  local_581._1_8_ = local_538;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffed48._8_8_,in_stack_ffffffffffffed48._0_8_,
             (allocator<char> *)CONCAT17(in_stack_ffffffffffffed47,in_stack_ffffffffffffed40));
  local_5b8[0x34] = 0;
  local_518 = local_578;
  local_510 = 3;
  v_02._M_array._4_4_ = in_stack_ffffffffffffed1c;
  v_02._M_array._0_4_ = in_stack_ffffffffffffed18;
  v_02._M_len._0_4_ = in_stack_ffffffffffffed20;
  v_02._M_len._4_4_ = in_stack_ffffffffffffed24;
  pstd::span<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::span(in_stack_ffffffffffffed10,v_02);
  requestedChannels_02.n = (size_t)in_stack_ffffffffffffedf8;
  requestedChannels_02.ptr = in_stack_ffffffffffffedf0;
  pbrt::Image::GetChannelDesc(in_stack_ffffffffffffede8,requestedChannels_02);
  local_f20 = (string *)&local_518;
  do {
    local_f20 = local_f20 + -0x20;
    std::__cxx11::string::~string(local_f20);
  } while (local_f20 != local_578);
  std::allocator<char>::~allocator((allocator<char> *)(local_5b8 + 0x35));
  std::allocator<char>::~allocator(&local_582);
  std::allocator<char>::~allocator(local_581);
  denoise::anon_class_8_1_5d0e180a::operator()
            ((anon_class_8_1_5d0e180a *)
             CONCAT44(in_stack_ffffffffffffed24,in_stack_ffffffffffffed20),
             (ImageChannelDesc *)CONCAT44(in_stack_ffffffffffffed1c,in_stack_ffffffffffffed18),
             (char *)in_stack_ffffffffffffed10);
  local_644 = 1;
  local_640 = local_638;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffed48._8_8_,in_stack_ffffffffffffed48._0_8_,
             (allocator<char> *)CONCAT17(in_stack_ffffffffffffed47,in_stack_ffffffffffffed40));
  local_640 = (string *)local_618;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffed48._8_8_,in_stack_ffffffffffffed48._0_8_,
             (allocator<char> *)CONCAT17(in_stack_ffffffffffffed47,in_stack_ffffffffffffed40));
  local_640 = (string *)local_5f8;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffed48._8_8_,in_stack_ffffffffffffed48._0_8_,
             (allocator<char> *)CONCAT17(in_stack_ffffffffffffed47,in_stack_ffffffffffffed40));
  local_644 = 0;
  local_5d8 = local_638;
  local_5d0 = 3;
  v_03._M_array._4_4_ = in_stack_ffffffffffffed1c;
  v_03._M_array._0_4_ = in_stack_ffffffffffffed18;
  v_03._M_len._0_4_ = in_stack_ffffffffffffed20;
  v_03._M_len._4_4_ = in_stack_ffffffffffffed24;
  pstd::span<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::span(in_stack_ffffffffffffed10,v_03);
  requestedChannels_03.n = (size_t)in_stack_ffffffffffffedf8;
  requestedChannels_03.ptr = in_stack_ffffffffffffedf0;
  pbrt::Image::GetChannelDesc(in_stack_ffffffffffffede8,requestedChannels_03);
  local_f70 = (string *)&local_5d8;
  do {
    local_f70 = local_f70 + -0x20;
    std::__cxx11::string::~string(local_f70);
  } while (local_f70 != local_638);
  std::allocator<char>::~allocator(&local_643);
  std::allocator<char>::~allocator(&local_642);
  std::allocator<char>::~allocator(&local_641);
  denoise::anon_class_8_1_5d0e180a::operator()
            ((anon_class_8_1_5d0e180a *)
             CONCAT44(in_stack_ffffffffffffed24,in_stack_ffffffffffffed20),
             (ImageChannelDesc *)CONCAT44(in_stack_ffffffffffffed1c,in_stack_ffffffffffffed18),
             (char *)in_stack_ffffffffffffed10);
  local_704 = 1;
  local_700 = local_6f8;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffed48._8_8_,in_stack_ffffffffffffed48._0_8_,
             (allocator<char> *)CONCAT17(in_stack_ffffffffffffed47,in_stack_ffffffffffffed40));
  local_700 = (string *)local_6d8;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffed48._8_8_,in_stack_ffffffffffffed48._0_8_,
             (allocator<char> *)CONCAT17(in_stack_ffffffffffffed47,in_stack_ffffffffffffed40));
  local_700 = (string *)local_6b8;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffed48._8_8_,in_stack_ffffffffffffed48._0_8_,
             (allocator<char> *)CONCAT17(in_stack_ffffffffffffed47,in_stack_ffffffffffffed40));
  local_704 = 0;
  local_698 = local_6f8;
  local_690 = 3;
  v_04._M_array._4_4_ = in_stack_ffffffffffffed1c;
  v_04._M_array._0_4_ = in_stack_ffffffffffffed18;
  v_04._M_len._0_4_ = in_stack_ffffffffffffed20;
  v_04._M_len._4_4_ = in_stack_ffffffffffffed24;
  pstd::span<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::span(in_stack_ffffffffffffed10,v_04);
  requestedChannels_04.n = (size_t)in_stack_ffffffffffffedf8;
  requestedChannels_04.ptr = in_stack_ffffffffffffedf0;
  pbrt::Image::GetChannelDesc(in_stack_ffffffffffffede8,requestedChannels_04);
  local_fc0 = (string *)&local_698;
  do {
    local_fc0 = local_fc0 + -0x20;
    std::__cxx11::string::~string(local_fc0);
  } while (local_fc0 != local_6f8);
  std::allocator<char>::~allocator(&local_703);
  std::allocator<char>::~allocator(&local_702);
  std::allocator<char>::~allocator(&local_701);
  denoise::anon_class_8_1_5d0e180a::operator()
            ((anon_class_8_1_5d0e180a *)
             CONCAT44(in_stack_ffffffffffffed24,in_stack_ffffffffffffed20),
             (ImageChannelDesc *)CONCAT44(in_stack_ffffffffffffed1c,in_stack_ffffffffffffed18),
             (char *)in_stack_ffffffffffffed10);
  local_782 = 1;
  local_780 = local_778;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffed48._8_8_,in_stack_ffffffffffffed48._0_8_,
             (allocator<char> *)CONCAT17(in_stack_ffffffffffffed47,in_stack_ffffffffffffed40));
  local_782 = 0;
  local_758 = local_778;
  local_750 = 1;
  v_05._M_array._4_4_ = in_stack_ffffffffffffed1c;
  v_05._M_array._0_4_ = in_stack_ffffffffffffed18;
  v_05._M_len._0_4_ = in_stack_ffffffffffffed20;
  v_05._M_len._4_4_ = in_stack_ffffffffffffed24;
  pstd::span<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::span(in_stack_ffffffffffffed10,v_05);
  requestedChannels_05.n = (size_t)in_stack_ffffffffffffedf8;
  requestedChannels_05.ptr = in_stack_ffffffffffffedf0;
  pbrt::Image::GetChannelDesc(in_stack_ffffffffffffede8,requestedChannels_05);
  local_ff0 = (string *)&local_758;
  do {
    local_ff0 = local_ff0 + -0x20;
    std::__cxx11::string::~string(local_ff0);
  } while (local_ff0 != local_778);
  std::allocator<char>::~allocator(&local_781);
  denoise::anon_class_8_1_5d0e180a::operator()
            ((anon_class_8_1_5d0e180a *)
             CONCAT44(in_stack_ffffffffffffed24,in_stack_ffffffffffffed20),
             (ImageChannelDesc *)CONCAT44(in_stack_ffffffffffffed1c,in_stack_ffffffffffffed18),
             (char *)in_stack_ffffffffffffed10);
  local_860 = &stack0xfffffffffffff7a8;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffed48._8_8_,in_stack_ffffffffffffed48._0_8_,
             (allocator<char> *)CONCAT17(in_stack_ffffffffffffed47,in_stack_ffffffffffffed40));
  local_860 = local_838;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffed48._8_8_,in_stack_ffffffffffffed48._0_8_,
             (allocator<char> *)CONCAT17(in_stack_ffffffffffffed47,in_stack_ffffffffffffed40));
  local_860 = local_818;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffed48._8_8_,in_stack_ffffffffffffed48._0_8_,
             (allocator<char> *)CONCAT17(in_stack_ffffffffffffed47,in_stack_ffffffffffffed40));
  local_860 = local_7f8;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffed48._8_8_,in_stack_ffffffffffffed48._0_8_,
             (allocator<char> *)CONCAT17(in_stack_ffffffffffffed47,in_stack_ffffffffffffed40));
  local_7d8 = &stack0xfffffffffffff7a8;
  local_7d0 = 4;
  v_06._M_array._4_4_ = in_stack_ffffffffffffed1c;
  v_06._M_array._0_4_ = in_stack_ffffffffffffed18;
  v_06._M_len._0_4_ = in_stack_ffffffffffffed20;
  v_06._M_len._4_4_ = in_stack_ffffffffffffed24;
  pstd::span<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::span(in_stack_ffffffffffffed10,v_06);
  requestedChannels_06.n = (size_t)in_stack_ffffffffffffedf8;
  requestedChannels_06.ptr = in_stack_ffffffffffffedf0;
  pbrt::Image::GetChannelDesc(in_stack_ffffffffffffede8,requestedChannels_06);
  local_1050 = (string *)&local_7d8;
  do {
    local_1050 = local_1050 + -0x20;
    std::__cxx11::string::~string(local_1050);
  } while (local_1050 != (string *)&stack0xfffffffffffff7a8);
  std::allocator<char>::~allocator(&local_864);
  std::allocator<char>::~allocator(&local_863);
  std::allocator<char>::~allocator(&local_862);
  std::allocator<char>::~allocator(&local_861);
  pbrt::ImageChannelValues::ImageChannelValues
            (in_stack_ffffffffffffed30,in_stack_ffffffffffffed28,in_stack_ffffffffffffed24);
  pbrt::Image::JointBilateralFilter
            (in_stack_ffffffffffffee80,in_stack_ffffffffffffee78,in_stack_ffffffffffffee74,
             in_stack_ffffffffffffee68,in_stack_ffffffffffffee60,in_stack_ffffffffffffeea0);
  uVar9 = 3;
  uVar8 = 3;
  this = (ImageAndMetadata *)local_5b8;
  puVar7 = local_458;
  denoiseImage(in_stack_fffffffffffff468,in_stack_fffffffffffff460,in_stack_fffffffffffff458,
               in_stack_fffffffffffff450,in_stack_fffffffffffff448,in_stack_fffffffffffff480,
               in_stack_fffffffffffff488,in_stack_fffffffffffff490,in_stack_fffffffffffff498);
  local_bf8 = (Tuple2<pbrt::Point2,_int>)pbrt::Image::Resolution(local_2e0);
  local_c84 = 1;
  local_c80 = local_c78;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffed48._8_8_,in_stack_ffffffffffffed48._0_8_,
             (allocator<char> *)CONCAT17(in_stack_ffffffffffffed47,in_stack_ffffffffffffed40));
  local_c80 = (string *)local_c58;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffed48._8_8_,in_stack_ffffffffffffed48._0_8_,
             (allocator<char> *)CONCAT17(in_stack_ffffffffffffed47,in_stack_ffffffffffffed40));
  local_c80 = (string *)local_c38;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffed48._8_8_,in_stack_ffffffffffffed48._0_8_,
             (allocator<char> *)CONCAT17(in_stack_ffffffffffffed47,in_stack_ffffffffffffed40));
  local_c84 = 0;
  local_c18 = local_c78;
  local_c10 = 3;
  v_07._M_array._4_4_ = in_stack_ffffffffffffed1c;
  v_07._M_array._0_4_ = uVar8;
  v_07._M_len._0_4_ = uVar9;
  v_07._M_len._4_4_ = in_stack_ffffffffffffed24;
  pstd::span<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::span((span<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          *)this,v_07);
  pbrt::ColorEncodingHandle::TaggedPointer((ColorEncodingHandle *)this,puVar7);
  pstd::pmr::polymorphic_allocator<std::byte>::polymorphic_allocator
            ((polymorphic_allocator<std::byte> *)this);
  channels.n = in_stack_ffffffffffffee48;
  channels.ptr = in_stack_ffffffffffffee40;
  pbrt::Image::Image(in_stack_ffffffffffffee30,in_stack_ffffffffffffee2c,
                     (Point2i)in_stack_ffffffffffffee50,channels,in_stack_ffffffffffffee20,
                     in_stack_ffffffffffffee38);
  local_10a0 = (string *)&local_c18;
  index = local_c98;
  do {
    local_10a0 = local_10a0 + -0x20;
    std::__cxx11::string::~string(local_10a0);
  } while (local_10a0 != local_c78);
  std::allocator<char>::~allocator(&local_c83);
  std::allocator<char>::~allocator(&local_c82);
  std::allocator<char>::~allocator(&local_c81);
  local_c9c = 0;
  while( true ) {
    iVar1 = local_c9c;
    local_ca4 = (Tuple2<pbrt::Point2,_int>)pbrt::Image::Resolution(local_2e0);
    if (local_ca4.y <= iVar1) break;
    local_ca8 = 0;
    while( true ) {
      iVar1 = local_ca8;
      local_cb0 = (Tuple2<pbrt::Point2,_int>)pbrt::Image::Resolution(local_2e0);
      if (local_cb0.x <= iVar1) break;
      pbrt::Point2<int>::Point2((Point2<int> *)this,(int)(index >> 0x20),(int)index);
      pbrt::WrapMode2D::WrapMode2D
                ((WrapMode2D *)CONCAT44(in_stack_ffffffffffffed24,uVar9),in_stack_ffffffffffffed1c);
      pbrt::Image::GetChannels
                (in_stack_ffffffffffffedf8,(Point2i)in_stack_ffffffffffffee08,
                 (WrapMode2D)in_stack_ffffffffffffee00.values);
      for (local_cf4 = 0; local_cf4 < 3; local_cf4 = local_cf4 + 1) {
        pbrt::Point2<int>::Point2((Point2<int> *)this,(int)(index >> 0x20),(int)index);
        pbrt::InlinedVector<float,_4,_pstd::pmr::polymorphic_allocator<float>_>::operator[]
                  ((InlinedVector<float,_4,_pstd::pmr::polymorphic_allocator<float>_> *)this,index);
        pbrt::Image::SetChannel
                  (in_stack_ffffffffffffed88,(Point2i)in_stack_ffffffffffffed90,
                   in_stack_ffffffffffffed48._60_4_,in_stack_ffffffffffffed48._56_4_);
      }
      pbrt::ImageChannelValues::~ImageChannelValues((ImageChannelValues *)0x3e7d4e);
      local_ca8 = local_ca8 + 1;
    }
    local_c9c = local_c9c + 1;
  }
  local_e00.optionalValue = (aligned_storage_t<sizeof(float),_alignof(float)>)0x0;
  local_e00.set = false;
  local_e00._5_3_ = 0;
  pstd::optional<float>::optional(&local_e00);
  auVar6 = ZEXT1664((undefined1  [16])0x0);
  local_df8 = (aligned_storage_t<sizeof(pbrt::SquareMatrix<4>),_alignof(pbrt::SquareMatrix<4>)>)
              vmovdqu64_avx512f(auVar6);
  local_db8 = 0;
  pstd::optional<pbrt::SquareMatrix<4>_>::optional
            ((optional<pbrt::SquareMatrix<4>_> *)&local_df8.__align);
  local_db4 = (aligned_storage_t<sizeof(pbrt::SquareMatrix<4>),_alignof(pbrt::SquareMatrix<4>)>)
              vmovdqu64_avx512f(auVar6);
  local_d74 = 0;
  pstd::optional<pbrt::SquareMatrix<4>_>::optional
            ((optional<pbrt::SquareMatrix<4>_> *)&local_db4.__align);
  local_d70 = (aligned_storage_t<sizeof(pbrt::Bounds2<int>),_alignof(pbrt::Bounds2<int>)>)0x0;
  local_d60 = 0;
  pstd::optional<pbrt::Bounds2<int>_>::optional((optional<pbrt::Bounds2<int>_> *)&local_d70.__align)
  ;
  local_d54 = 0;
  local_d5c = (aligned_storage_t<sizeof(pbrt::Point2<int>),_alignof(pbrt::Point2<int>)>)0x0;
  pstd::optional<pbrt::Point2<int>_>::optional((optional<pbrt::Point2<int>_> *)&local_d5c.__align);
  local_d50.optionalValue = (aligned_storage_t<sizeof(int),_alignof(int)>)0x0;
  local_d50.set = false;
  local_d50._5_3_ = 0;
  pstd::optional<int>::optional(&local_d50);
  local_d48.optionalValue = (aligned_storage_t<sizeof(float),_alignof(float)>)0x0;
  local_d48.set = false;
  local_d48._5_3_ = 0;
  pstd::optional<float>::optional(&local_d48);
  local_d40 = (aligned_storage_t<sizeof(const_pbrt::RGBColorSpace_*),_alignof(const_pbrt::RGBColorSpace_*)>
               )0x0;
  uStack_d38 = 0;
  pstd::optional<const_pbrt::RGBColorSpace_*>::optional
            ((optional<const_pbrt::RGBColorSpace_*> *)&local_d40.__align);
  uStack_d10 = 0;
  uStack_d08 = 0;
  local_d30 = 0;
  uStack_d28 = 0;
  uStack_d20 = 0;
  uStack_d18 = 0;
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
  ::map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
         *)0x3e7ec3);
  bVar2 = pbrt::Image::Write(in_stack_fffffffffffff580,in_stack_fffffffffffff578,
                             in_stack_fffffffffffff570);
  bVar3 = bVar2 ^ 0xff;
  pbrt::ImageMetadata::~ImageMetadata((ImageMetadata *)this);
  __stream = _stderr;
  bVar2 = (bVar3 & 1) != 0;
  if (bVar2) {
    uVar5 = std::__cxx11::string::c_str();
    fprintf(__stream,"%s: couldn\'t write image.\n",uVar5);
  }
  local_4 = (uint)bVar2;
  pbrt::Image::~Image(&this->image);
  pbrt::Image::~Image(&this->image);
  pbrt::Image::~Image(&this->image);
  pbrt::ImageChannelValues::~ImageChannelValues((ImageChannelValues *)0x3e7fc7);
  pbrt::ImageChannelDesc::~ImageChannelDesc((ImageChannelDesc *)0x3e7fd4);
  pbrt::ImageChannelDesc::~ImageChannelDesc((ImageChannelDesc *)0x3e7fe1);
  pbrt::ImageChannelDesc::~ImageChannelDesc((ImageChannelDesc *)0x3e7fee);
  pbrt::ImageChannelDesc::~ImageChannelDesc((ImageChannelDesc *)0x3e7ffb);
  pbrt::ImageChannelDesc::~ImageChannelDesc((ImageChannelDesc *)0x3e8008);
  pbrt::ImageChannelDesc::~ImageChannelDesc((ImageChannelDesc *)0x3e8015);
  pbrt::ImageChannelDesc::~ImageChannelDesc((ImageChannelDesc *)0x3e8022);
  pbrt::ImageChannelDesc::~ImageChannelDesc((ImageChannelDesc *)0x3e802f);
  pbrt::ImageAndMetadata::~ImageAndMetadata(this);
  std::__cxx11::string::~string(local_50);
  std::__cxx11::string::~string(local_30);
  return local_4;
}

Assistant:

int denoise(int argc, char *argv[]) {
    std::string inFilename, outFilename;

    auto onError = [](const std::string &err) {
        usage("denoise", "%s", err.c_str());
        exit(1);
    };
    while (*argv != nullptr) {
        if (ParseArg(&argv, "outfile", &outFilename, onError)) {
            // success
        } else if (argv[0][0] == '-')
            usage("denoise", "%s: unknown command flag", *argv);
        else if (inFilename.empty()) {
            inFilename = *argv;
            ++argv;
        } else
            usage("denoise", "multiple input filenames provided.");
    }
    if (inFilename.empty())
        usage("denoise", "input image filename must be provided.");
    if (outFilename.empty())
        usage("denoise", "output image filename must be provided.");

    ImageAndMetadata im = Image::Read(inFilename);
    Image &in = im.image;

    auto checkForChannels = [&inFilename](ImageChannelDesc &desc, const char *names) {
        if (!desc) {
            fprintf(stderr, "%s: didn't find \"%s\" channels.\n", inFilename.c_str(),
                    names);
            exit(1);
        }
    };
    ImageChannelDesc rgbDesc = in.GetChannelDesc({"R", "G", "B"});
    checkForChannels(rgbDesc, "R,G,B");
    ImageChannelDesc zDesc = in.GetChannelDesc({"Pz"});
    checkForChannels(zDesc, "Pz");
    ImageChannelDesc deltaZDesc = in.GetChannelDesc({"dzdx", "dzdy"});
    checkForChannels(deltaZDesc, "dzdx,dzdy");
    ImageChannelDesc nDesc = in.GetChannelDesc({"Nx", "Ny", "Nz"});
    checkForChannels(nDesc, "Nx,Ny,Nz");
    ImageChannelDesc nsDesc = in.GetChannelDesc({"Nsx", "Nsy", "Nsz"});
    checkForChannels(nsDesc, "Nsx,Nsy,Nsz");
    ImageChannelDesc albedoDesc = in.GetChannelDesc({"Albedo.R", "Albedo.G", "Albedo.B"});
    checkForChannels(albedoDesc, "Albedo.R,Albedo.G,Albedo.B");
    ImageChannelDesc varianceDesc = in.GetChannelDesc({"rgbVariance"});
    checkForChannels(varianceDesc, "rgbVariance");

    ImageChannelDesc jointDesc = in.GetChannelDesc({"Pz", "Nx", "Ny", "Nz"});
    ImageChannelValues jointSigmaIndir(4, 1);
    Float xySigmaIndir[2] = {2.f, 2.f};
    Image filteredVariance = in.JointBilateralFilter(varianceDesc, 7, xySigmaIndir,
                                                     jointDesc, jointSigmaIndir);

    int halfWidth = 3;
    int nLevels = 3;
    Image denoisedImage = denoiseImage(in, rgbDesc, filteredVariance, albedoDesc, zDesc,
                                       deltaZDesc, nsDesc, halfWidth, nLevels);

    Image result(PixelFormat::Float, in.Resolution(), {"R", "G", "B"});
    for (int y = 0; y < in.Resolution().y; ++y)
        for (int x = 0; x < in.Resolution().x; ++x) {
            ImageChannelValues Ldenoised = denoisedImage.GetChannels({x, y});
            for (int c = 0; c < 3; ++c)
                result.SetChannel({x, y}, c, Ldenoised[c]);
        }

    if (!result.Write(outFilename)) {
        fprintf(stderr, "%s: couldn't write image.\n", outFilename.c_str());
        return 1;
    }
    return 0;
}